

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

int __thiscall
duckdb::Interpolator<false>::Operation<int,int,duckdb::QuantileDirect<int>>
          (Interpolator<false> *this,int *v_t,Vector *result,QuantileDirect<int> *accessor)

{
  uint uVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  long lVar5;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<int>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<int>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<int>_>_> __comp_01;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  undefined1 auVar9 [12];
  int result_1;
  int local_44;
  string local_40;
  
  bVar7 = this->desc;
  iVar2 = this->FRN;
  iVar3 = this->begin;
  iVar4 = this->end;
  local_40._M_dataplus._M_p = (pointer)accessor;
  local_40._M_string_length = (size_type)accessor;
  local_40.field_2._M_local_buf[0] = bVar7;
  if (this->CRN == iVar2) {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar8 = (long)(iVar4 * 4 + iVar3 * -4) >> 2;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar7;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<int>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    uVar1 = v_t[this->FRN];
    bVar7 = TryCast::Operation<int,int>(uVar1,&local_44,false);
    if (!bVar7) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar1,auVar9._8_4_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_40);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar8 = (long)(iVar4 * 4 + iVar3 * -4) >> 2;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar7;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<int>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar2 = this->FRN;
    iVar3 = this->end;
    local_40._M_dataplus._M_p = (pointer)accessor;
    local_40._M_string_length = (size_type)accessor;
    local_40.field_2._M_local_buf[0] = bVar7;
    if (this->CRN != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 4 + iVar2 * -4) >> 2;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar7;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<int>>>>
                (v_t + iVar2,v_t + this->CRN,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    uVar1 = v_t[this->FRN];
    bVar7 = TryCast::Operation<int,int>(uVar1,&local_44,false);
    iVar6 = local_44;
    if (!bVar7) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar1,auVar9._8_4_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_40);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    uVar1 = v_t[this->CRN];
    bVar7 = TryCast::Operation<int,int>(uVar1,&local_44,false);
    if (!bVar7) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar1,auVar9._8_4_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_40);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_44 = (int)((double)(local_44 - iVar6) *
                     (this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                    (double)iVar6);
  }
  return local_44;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}